

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool getBit(FILE *f)

{
  byte bVar1;
  char local_11;
  bool ret;
  FILE *pFStack_10;
  uchar check;
  FILE *f_local;
  
  if (((getBit::count == '\0') &&
      (pFStack_10 = (FILE *)f, fread(&getBit::buf,1,1,(FILE *)f), getBit::buf == 0xff)) &&
     (fread(&local_11,1,1,pFStack_10), local_11 != '\0')) {
    fprintf(_stderr,anon_var_dwarf_3221);
  }
  bVar1 = 7 - getBit::count;
  if (getBit::count == '\a') {
    getBit::count = '\0';
  }
  else {
    getBit::count = getBit::count + '\x01';
  }
  return ((uint)getBit::buf & 1 << (bVar1 & 0x1f)) != 0;
}

Assistant:

bool getBit(FILE *f) {
    static unsigned char buf;
    static unsigned char count = 0;
    if (count == 0) {
        fread(&buf, 1, 1, f);
        if (buf == 0xFF) {
            unsigned char check;
            fread(&check, 1, 1, f);
            if (check != 0x00) {
                fprintf(stderr, "data 段有不是 0xFF00 的數據");
            }
        }
    }
    bool ret = buf & (1 << (7 - count));
    count = (count == 7 ? 0 : count + 1);
    return ret;
}